

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

bool __thiscall
QItemSelectionModel::isRowSelected(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  uint uVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  int *piVar4;
  pointer pQVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  parameter_type pQVar11;
  const_iterator cVar12;
  int iVar13;
  QItemSelectionRangeRefCache *curSel;
  pointer this_01;
  QItemSelectionRange *pQVar14;
  const_iterator cVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  QItemSelectionRange *selection;
  QModelIndex *this_02;
  ulong uVar20;
  long in_FS_OFFSET;
  vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> local_68;
  int local_50 [2];
  QModelIndex *local_48;
  long *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar2 + 0x78);
  pQVar11 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::value(this_00);
  if ((pQVar11 == (parameter_type)0x0) ||
     ((((-1 < parent->r && (-1 < parent->c)) && ((parent->m).ptr != (QAbstractItemModel *)0x0)) &&
      (pQVar11 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                 ::value(this_00), pQVar11 != (parent->m).ptr)))) {
LAB_0046e479:
    bVar6 = false;
  }
  else {
    if ((*(byte *)(lVar2 + 0xb8) & 4) != 0) {
      cVar15.i = *(QItemSelectionRange **)(lVar2 + 0xa0);
      pQVar14 = cVar15.i + *(long *)(lVar2 + 0xa8);
      lVar17 = *(long *)(lVar2 + 0xa8) >> 2;
      local_50[0] = row;
      local_48 = parent;
      if (0 < lVar17) {
        lVar17 = lVar17 + 1;
        do {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar15);
          cVar12.i = cVar15.i;
          if (bVar6) goto LAB_0046e474;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar15.i + 1);
          cVar12.i = cVar15.i + 1;
          if (bVar6) goto LAB_0046e474;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar15.i + 2);
          cVar12.i = cVar15.i + 2;
          if (bVar6) goto LAB_0046e474;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                *)local_50,cVar15.i + 3);
          cVar12.i = cVar15.i + 3;
          if (bVar6) goto LAB_0046e474;
          cVar15.i = cVar15.i + 4;
          lVar17 = lVar17 + -1;
        } while (1 < lVar17);
      }
      lVar17 = (long)pQVar14 - (long)cVar15.i >> 4;
      if (lVar17 == 1) {
LAB_0046e45e:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)local_50,cVar15);
        cVar12.i = cVar15.i;
        if (!bVar6) {
          cVar12.i = pQVar14;
        }
      }
      else if (lVar17 == 2) {
LAB_0046e438:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                              *)local_50,cVar15);
        cVar12.i = cVar15.i;
        if (!bVar6) {
          cVar15.i = cVar15.i + 1;
          goto LAB_0046e45e;
        }
      }
      else {
        cVar12.i = pQVar14;
        if ((lVar17 == 3) &&
           (bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__0::operator()<int,QModelIndex>(int,QModelIndex_const&)const::_lambda(auto:1_const&)_1_>
                                  *)local_50,cVar15), cVar12.i = cVar15.i, !bVar6)) {
          cVar15.i = cVar15.i + 1;
          goto LAB_0046e438;
        }
      }
LAB_0046e474:
      if (cVar12.i != pQVar14) goto LAB_0046e479;
    }
    if (((*(byte *)(lVar2 + 0xb8) & 8) != 0) && (lVar17 = *(long *)(lVar2 + 0xa8), lVar17 != 0)) {
      this_02 = *(QModelIndex **)(lVar2 + 0xa0);
      piVar4 = &this_02->r;
      do {
        iVar8 = QPersistentModelIndex::row((QPersistentModelIndex *)this_02);
        if ((iVar8 <= row) &&
           (iVar8 = QPersistentModelIndex::row((QPersistentModelIndex *)&this_02->i), row <= iVar8))
        {
          cVar15.i = *(QItemSelectionRange **)(lVar2 + 0x88);
          pQVar14 = cVar15.i + *(long *)(lVar2 + 0x90);
          lVar18 = *(long *)(lVar2 + 0x90) >> 2;
          local_50[0] = row;
          local_48 = this_02;
          if (0 < lVar18) {
            lVar18 = lVar18 + 1;
            do {
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar15);
              cVar12.i = cVar15.i;
              if (bVar6) goto LAB_0046e5dc;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar15.i + 1);
              cVar12.i = cVar15.i + 1;
              if (bVar6) goto LAB_0046e5dc;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar15.i + 2);
              cVar12.i = cVar15.i + 2;
              if (bVar6) goto LAB_0046e5dc;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                      ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                    *)local_50,cVar15.i + 3);
              cVar12.i = cVar15.i + 3;
              if (bVar6) goto LAB_0046e5dc;
              cVar15.i = cVar15.i + 4;
              lVar18 = lVar18 + -1;
            } while (1 < lVar18);
          }
          lVar18 = (long)pQVar14 - (long)cVar15.i >> 4;
          if (lVar18 == 1) {
LAB_0046e5c8:
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)local_50,cVar15);
            cVar12.i = cVar15.i;
            if (!bVar6) {
              cVar12.i = pQVar14;
            }
          }
          else if (lVar18 == 2) {
LAB_0046e5a4:
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                  *)local_50,cVar15);
            cVar12.i = cVar15.i;
            if (!bVar6) {
              cVar15.i = cVar15.i + 1;
              goto LAB_0046e5c8;
            }
          }
          else {
            cVar12.i = pQVar14;
            if ((lVar18 == 3) &&
               (bVar6 = __gnu_cxx::__ops::
                        _Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::$_1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::{lambda(auto:1_const&)#1}>
                        ::operator()((_Iter_pred<QItemSelectionModel::isRowSelected(int,QModelIndex_const&)const::__1::operator()<int,QItemSelectionRange>(int,QItemSelectionRange_const&)const::_lambda(auto:1_const&)_1_>
                                      *)local_50,cVar15), cVar12.i = cVar15.i, !bVar6)) {
              cVar15.i = cVar15.i + 1;
              goto LAB_0046e5a4;
            }
          }
LAB_0046e5dc:
          if (cVar12.i != pQVar14) goto LAB_0046e479;
        }
        this_02 = (QModelIndex *)&this_02->m;
      } while (this_02 != (QModelIndex *)(piVar4 + lVar17 * 4));
    }
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    iVar8 = (**(code **)(**(long **)(lVar2 + 0x78) + 0x80))(*(long **)(lVar2 + 0x78),parent);
    local_68.
    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::reserve
              (&local_68,*(long *)(lVar2 + 0x90) + *(long *)(lVar2 + 0xa8));
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (*(QItemSelectionRange **)(lVar2 + 0xa0),
               *(QItemSelectionRange **)(lVar2 + 0xa0) + *(long *)(lVar2 + 0xa8),&local_68);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (*(QItemSelectionRange **)(lVar2 + 0x88),
               *(QItemSelectionRange **)(lVar2 + 0x88) + *(long *)(lVar2 + 0x90),&local_68);
    bVar6 = iVar8 < 1;
    if (iVar8 < 1) {
      iVar13 = 0;
    }
    else {
      uVar20 = 0;
      iVar13 = 0;
      do {
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(this_00);
        pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar19 = (int)uVar20;
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                  (local_50,pQVar3,(ulong)(uint)row,uVar20,parent);
        if ((local_40 == (long *)0x0) ||
           (uVar9 = (**(code **)(*local_40 + 0x138))(local_40,local_50), (~uVar9 & 0x21) != 0)) {
          iVar13 = iVar13 + 1;
        }
        else {
          pQVar5 = local_68.
                   super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar16 = false;
          this_01 = local_68.
                    super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_68.
              super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_68.
              super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              uVar9 = (uint)uVar20;
              bVar7 = QItemSelectionRangeRefCache::contains(this_01,row,uVar9,parent);
              if (bVar7) {
                uVar1 = this_01->m_right;
                if ((int)uVar9 < (int)uVar1) {
                  do {
                    uVar9 = uVar9 + 1;
                    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                    ::value(this_00);
                    pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
                    (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                              (local_50,pQVar3,(ulong)(uint)row,(ulong)uVar9,parent);
                    if (local_40 == (long *)0x0) {
                      uVar10 = 1;
                    }
                    else {
                      uVar10 = (**(code **)(*local_40 + 0x138))(local_40,local_50);
                      uVar10 = (uint)((~uVar10 & 0x21) != 0);
                    }
                    iVar13 = iVar13 + uVar10;
                  } while (uVar9 != uVar1);
                }
                this_01->m_top = -1;
                this_01->m_left = -1;
                this_01->m_bottom = -1;
                this_01->m_right = -1;
                bVar16 = true;
                uVar20 = (ulong)uVar1;
              }
              iVar19 = (int)uVar20;
              this_01 = this_01 + 1;
            } while (!bVar7 && this_01 != pQVar5);
          }
          if (!bVar16) break;
        }
        uVar9 = iVar19 + 1;
        uVar20 = (ulong)uVar9;
        bVar6 = iVar8 <= (int)uVar9;
      } while ((int)uVar9 < iVar8);
    }
    if (local_68.
        super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar6 = (bool)(bVar6 & iVar13 < iVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QItemSelectionModel::isRowSelected(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
        return false;

    // return false if row exist in currentSelection (Deselect)
    if (d->currentCommand & Deselect) {
        const auto matches = [](auto row, const auto &parent) {
            return [row, &parent](const auto &selection) {
                return row >= selection.top() &&
                       row <= selection.bottom() &&
                       parent == selection.parent();
            };
        };
        if (std::any_of(d->currentSelection.cbegin(), d->currentSelection.cend(), matches(row, parent)))
            return false;
    }
    // return false if ranges in both currentSelection and ranges
    // intersect and have the same row contained
    if (d->currentCommand & Toggle) {
        for (const auto &selection : d->currentSelection) {
            if (row >= selection.top() && row <= selection.bottom()) {
                const auto intersects = [](auto row, const auto &selection) {
                    return [row, &selection](const auto &range) {
                        return row >= range.top() &&
                               row <= range.bottom() &&
                               selection.intersected(range).isValid();
                    };
                };
                if (std::any_of(d->ranges.cbegin(), d->ranges.cend(), intersects(row, selection)))
                    return false;
            }
        }
    }

    auto isSelectable = [&](int row, int column) {
        return isSelectableAndEnabled(d->model->index(row, column, parent).flags());
    };

    const int colCount = d->model->columnCount(parent);
    int unselectable = 0;
    std::vector<QItemSelectionRangeRefCache> cache;
    cache.reserve(d->currentSelection.size() + d->ranges.size());
    std::copy(d->currentSelection.begin(), d->currentSelection.end(), std::back_inserter(cache));
    std::copy(d->ranges.begin(), d->ranges.end(), std::back_inserter(cache));

    // check ranges and currentSelection
    for (int column = 0; column < colCount; ++column) {
        if (!isSelectable(row, column)) {
            ++unselectable;
            continue;
        }
        bool foundSelection = false;
        for (auto &curSel : cache) {
            if (curSel.contains(row, column, parent)) {
                const auto right = curSel.right();
                for (int i = column + 1; i <= right; ++i) {
                    if (!isSelectable(row, i))
                        ++unselectable;
                }
                column = right;
                foundSelection = true;
                curSel.invalidate();
                break;
            }
        }
        if (!foundSelection)
            return false;
    }
    return unselectable < colCount;
}